

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

string * __thiscall
XPMP2::Aircraft::SoundGetName_abi_cxx11_(Aircraft *this,SoundEventsTy sndEvent,float *volAdj)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  float *in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  string *in_RDI;
  allocator<char> *in_stack_fffffffffffffea0;
  allocator<char> *paVar5;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint uVar6;
  allocator<char> local_a1;
  string local_a0 [35];
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  undefined1 local_79 [38];
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d [13];
  string local_40 [32];
  float *local_20;
  undefined4 local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  iVar3 = CSLModel::GetNumEngines((CSLModel *)0x36abb5);
  *local_20 = (float)iVar3;
  switch(local_14) {
  case 0:
    if (in_RSI[0x3f] == 0) {
      if (glob < 3) {
        uVar6 = *(uint *)(in_RSI + 1);
        (**(code **)(*in_RSI + 0x10))();
        uVar4 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
               ,0x30c,"SoundGetName",logWARN,
               "Aircraft %08X (%s): No CSL model info, using default engine sound",(ulong)uVar6,
               uVar4);
        std::__cxx11::string::~string(local_40);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::allocator<char>::~allocator(local_4d);
    }
    else {
      bVar1 = IsGroundVehicle((Aircraft *)0x36ad3e);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        std::allocator<char>::~allocator(&local_4e);
      }
      else {
        bVar1 = CSLModel::HasRotor((CSLModel *)0x36adc3);
        if (bVar1) {
          *local_20 = *local_20 + 1.0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          std::allocator<char>::~allocator(&local_4f);
        }
        else {
          cVar2 = CSLModel::GetClassEngType((CSLModel *)0x36ae67);
          switch(cVar2) {
          case 'E':
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
            std::allocator<char>::~allocator(&local_50);
            break;
          default:
            if (glob < 3) {
              uVar6 = *(uint *)(in_RSI + 1);
              (**(code **)(*in_RSI + 0x10))();
              uVar4 = std::__cxx11::string::c_str();
              cVar2 = CSLModel::GetClassEngType((CSLModel *)0x36b0e6);
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                     ,0x31e,"SoundGetName",logWARN,
                     "Aircraft %08X (%s): Unknown engine type \'%c\', using default engine sound",
                     (ulong)uVar6,uVar4,(int)cVar2);
              std::__cxx11::string::~string((string *)(local_79 + 1));
            }
            this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
            std::allocator<char>::~allocator((allocator<char> *)local_79);
            break;
          case 'J':
            CSLModel::GetClassNumEng((CSLModel *)0x36af17);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
            std::allocator<char>::~allocator(&local_51);
            break;
          case 'P':
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
            std::allocator<char>::~allocator(&local_52);
            break;
          case 'T':
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
            std::allocator<char>::~allocator(&local_53);
          }
        }
      }
    }
    break;
  case 1:
    paVar5 = &local_7a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,(char *)paVar5,in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator(&local_7a);
    break;
  case 2:
    *local_20 = *local_20 * 0.5;
    paVar5 = &local_7b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,paVar5);
    std::allocator<char>::~allocator(&local_7b);
    break;
  case 3:
    *local_20 = *local_20 * 0.25;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator(&local_7c);
    break;
  case 4:
    *local_20 = *local_20 * 0.25;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator(&local_7d);
    break;
  default:
    if (glob < 4) {
      uVar6 = *(uint *)(in_RSI + 1);
      (**(code **)(*in_RSI + 0x10))();
      uVar4 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x32a,"SoundGetName",logERR,
             "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",(ulong)uVar6,
             uVar4,local_14);
      std::__cxx11::string::~string(local_a0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return in_RDI;
}

Assistant:

std::string Aircraft::SoundGetName (SoundEventsTy sndEvent, float& volAdj) const
{
    // The default is: The more engines, the louder;
    // that not ownly goes for engine sounds, but also the rest will be bigger the bigger the plane
    volAdj = float(pCSLMdl->GetNumEngines());
    // Now go by event type:
    switch (sndEvent) {
        // Engine Sound is based on aircraft classification
        case SND_ENG:
            // Sanity check: need a CSL model to derive details
            if (!pCSLMdl) {
                LOG_MSG(logWARN, "Aircraft %08X (%s): No CSL model info, using default engine sound",
                        modeS_id, GetFlightId().c_str());
                return XP_SOUND_PROP_AIRPLANE;
            }
            // Now check out engine type and return proper sound name
            if (IsGroundVehicle()) {                                // We assume all ground vehicles are electric cars by now...they should be at least ;-)
                return XP_SOUND_ELECTRIC;
            }
            if (pCSLMdl->HasRotor()) {
                volAdj += 1.0f;                                     // Helis are loud anyway, but louder with more engines
                return XP_SOUND_PROP_HELI;
            }
            switch (pCSLMdl->GetClassEngType()) {
                case 'E': return XP_SOUND_ELECTRIC;
                case 'J': return pCSLMdl->GetClassNumEng() == '1' ? XP_SOUND_HIBYPASSJET : XP_SOUND_LOBYPASSJET;
                case 'P': return XP_SOUND_PROP_AIRPLANE;
                case 'T': return XP_SOUND_TURBOPROP;
                default:
                    LOG_MSG(logWARN, "Aircraft %08X (%s): Unknown engine type '%c', using default engine sound",
                            modeS_id, GetFlightId().c_str(), pCSLMdl->GetClassEngType());
                    return XP_SOUND_PROP_AIRPLANE;
            }
            
        // All other sound types have constant sounds assigned
        case SND_REVERSE_THRUST:                        return XP_SOUND_REVERSE_THRUST;
        case SND_TIRE:              volAdj *= 0.50f;    return XP_SOUND_ROLL_RUNWAY;
        case SND_GEAR:              volAdj *= 0.25f;    return XP_SOUND_GEAR;   // that sound is too loud compared to engines, make it more quiet
        case SND_FLAPS:             volAdj *= 0.25f;    return XP_SOUND_FLAP;   // that sound is too loud compared to engines, make it more quiet
            
        default:
            LOG_MSG(logERR, "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",
                    modeS_id, GetFlightId().c_str(), int(sndEvent));
            return "";
    }
}